

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.h
# Opt level: O2

char * __thiscall Memory::JitArenaAllocator::Alloc(JitArenaAllocator *this,size_t requestedBytes)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  BVSparseNode *node;
  undefined8 *in_FS_OFFSET;
  
  if (requestedBytes != 0x18) {
    pcVar4 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                       ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this,
                        requestedBytes);
    return pcVar4;
  }
  pcVar4 = *(char **)(this + 0x80);
  if (pcVar4 == (char *)0x0) {
    if (Js::Configuration::Global[5] == '\x01') {
      pcVar4 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocFromHeap<true>((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                                    *)this,0x18);
      return pcVar4;
    }
    pcVar4 = *(char **)(this + 0x30);
    pcVar5 = (char *)(*(ulong *)(this + 0x40) & 0xfffffffffffffffc);
    if (pcVar5 < pcVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0xb5,"(cacheBlockEnd >= cacheBlockCurrent)",
                         "cacheBlockEnd >= cacheBlockCurrent");
      if (!bVar3) goto LAB_002271c4;
      *puVar1 = 0;
      pcVar4 = *(char **)(this + 0x30);
      pcVar5 = (char *)(*(ulong *)(this + 0x40) & 0xfffffffffffffffc);
    }
    if ((ulong)((long)pcVar5 - (long)pcVar4) < 0x18) {
      pcVar4 = ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::SnailAlloc
                         ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this
                          ,0x18);
      return pcVar4;
    }
    lVar7 = *(long *)(this + 0x10);
    pcVar6 = pcVar4;
    if ((char *)(lVar7 + *(long *)(lVar7 + 8) + 0x20) != pcVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0xb9,"(cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes)",
                         "cacheBlockEnd == bigBlocks->GetBytes() + bigBlocks->nbytes");
      if (!bVar3) goto LAB_002271c4;
      *puVar1 = 0;
      lVar7 = *(long *)(this + 0x10);
      pcVar6 = *(char **)(this + 0x30);
    }
    if ((pcVar6 < (char *)(lVar7 + 0x20)) ||
       ((char *)(*(ulong *)(this + 0x40) & 0xfffffffffffffffc) < pcVar6)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
                         ,0xba,
                         "(bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd)"
                         ,
                         "bigBlocks->GetBytes() <= cacheBlockCurrent && cacheBlockCurrent <= cacheBlockEnd"
                        );
      if (!bVar3) {
LAB_002271c4:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    *(char **)(this + 0x30) = pcVar4 + 0x18;
    ArenaMemoryTracking::ReportAllocation((Allocator *)this,pcVar4,0x18);
  }
  else {
    *(undefined8 *)(this + 0x80) = *(undefined8 *)pcVar4;
  }
  return pcVar4;
}

Assistant:

char * Alloc(DECLSPEC_GUARD_OVERFLOW size_t requestedBytes)
    {
        // Fast path
        if (sizeof(BVSparseNode) == requestedBytes)
        {
            // Fast path for BVSparseNode allocation
            if (bvFreeList)
            {
                BVSparseNode *node = bvFreeList;
                bvFreeList = bvFreeList->next;
                return (char*)node;
            }

            // If the free list is empty, then do the allocation right away for the BVSparseNode size.
            // You could call ArenaAllocator::Alloc here, but direct RealAlloc avoids unnecessary checks.
            return ArenaAllocatorBase::RealAllocInlined(requestedBytes);
        }
        return ArenaAllocator::Alloc(requestedBytes);

    }